

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rank.cc
# Opt level: O0

Entry * __thiscall rank::Rank::find(Rank *this,Key key)

{
  bool bVar1;
  pointer this_00;
  Entry *pEVar2;
  reference pEVar3;
  __normal_iterator<const_rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_>
  local_40 [2];
  Entry *local_30;
  Entry *local_28;
  __normal_iterator<const_rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_>
  local_20;
  __normal_iterator<const_rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_> it
  ;
  Key key_local;
  Rank *this_local;
  
  it._M_current = (Entry *)key;
  local_28 = (Entry *)std::vector<rank::Entry,_std::allocator<rank::Entry>_>::begin(&this->_entries)
  ;
  local_30 = (Entry *)std::vector<rank::Entry,_std::allocator<rank::Entry>_>::end(&this->_entries);
  local_20 = std::
             lower_bound<__gnu_cxx::__normal_iterator<rank::Entry_const*,std::vector<rank::Entry,std::allocator<rank::Entry>>>,unsigned_long,rank::Rank::find(unsigned_long)const::__0>
                       (local_28,local_30,&it);
  local_40[0]._M_current =
       (Entry *)std::vector<rank::Entry,_std::allocator<rank::Entry>_>::end(&this->_entries);
  bVar1 = __gnu_cxx::operator==(&local_20,local_40);
  if (!bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_>
              ::operator->(&local_20);
    pEVar2 = (Entry *)Entry::key(this_00);
    if (pEVar2 == it._M_current) {
      pEVar3 = __gnu_cxx::
               __normal_iterator<const_rank::Entry_*,_std::vector<rank::Entry,_std::allocator<rank::Entry>_>_>
               ::operator*(&local_20);
      return pEVar3;
    }
  }
  return (Entry *)0x0;
}

Assistant:

const Entry* Rank::find(Key key) const {
        auto it = std::lower_bound(_entries.begin(), _entries.end(), key, [](const Entry& r, Key key) { return r.key() < key; });
        return (it == _entries.end() || it->key() != key) ? nullptr : &(*it);
    }